

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

QList<QByteArray> * QTimeZone::availableTimeZoneIds(void)

{
  long lVar1;
  QTimeZonePrivate *pQVar2;
  QList<QByteArray> *in_RDI;
  long in_FS_OFFSET;
  QUtcTimeZonePrivate *in_stack_ffffffffffffff10;
  QUtcTimeZonePrivate *in_stack_ffffffffffffff40;
  undefined1 local_b0 [32];
  QList<QByteArray> *in_stack_ffffffffffffff70;
  QList<QByteArray> *in_stack_ffffffffffffff78;
  QUtcTimeZonePrivate *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QUtcTimeZonePrivate::QUtcTimeZonePrivate(in_stack_ffffffffffffff40);
  QUtcTimeZonePrivate::availableTimeZoneIds(in_stack_ffffffffffffffb0);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::operator->
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_> *)
             0x581d9d);
  pQVar2 = QExplicitlySharedDataPointer<QTimeZonePrivate>::operator->
                     ((QExplicitlySharedDataPointer<QTimeZonePrivate> *)0x581dae);
  (*pQVar2->_vptr_QTimeZonePrivate[0x15])(local_b0);
  set_union(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x581de7);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x581df4);
  QUtcTimeZonePrivate::~QUtcTimeZonePrivate(in_stack_ffffffffffffff10);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArray> QTimeZone::availableTimeZoneIds()
{
    // Backends MUST implement availableTimeZoneIds().
    // The return from each backend MUST be sorted and unique.
    return set_union(QUtcTimeZonePrivate().availableTimeZoneIds(),
                     global_tz->backend->availableTimeZoneIds());
}